

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongRunningShaderTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Stress::anon_unknown_1::LongRunningShaderCase::init
          (LongRunningShaderCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  ShaderType SVar2;
  IterCountType IVar3;
  Params *pPVar4;
  char *pcVar5;
  ShaderProgram *pSVar6;
  int extraout_EAX;
  ostream *poVar7;
  TestError *this_00;
  long lVar8;
  char *pcVar9;
  string iterCount;
  ostringstream vert;
  ostringstream frag;
  size_type *local_610;
  value_type local_608;
  ShaderProgram *local_5e8;
  RenderContext *local_5e0;
  long *local_5d8;
  long local_5d0;
  long local_5c8 [2];
  long *local_5b8;
  long local_5b0;
  long local_5a8 [2];
  uint local_598;
  value_type local_590;
  undefined1 local_570 [112];
  ios_base local_500 [8];
  ios_base local_4f8 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_4e0;
  deUint32 local_4c8;
  undefined1 local_4c0 [208];
  ProgramSources local_3f0;
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  local_5e8 = (ShaderProgram *)operator_new(0xd0);
  local_5e0 = ((this->super_TestCase).m_context)->m_renderCtx;
  pPVar4 = this->m_params;
  SVar2 = pPVar4->shaderType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"in highp vec2 a_position;\n",0x1a);
  poVar7 = (ostream *)local_1a8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"#version 300 es\n",0x10);
  if (pPVar4->iterCountType == ITERCOUNTTYPE_UNIFORM) {
    poVar7 = (ostream *)local_320;
    if (SVar2 != SHADERTYPE_VERTEX) {
      poVar7 = (ostream *)local_1a8;
    }
    pcVar9 = "uniform highp int u_iterCount;\n";
LAB_013c84dc:
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,0x1f);
LAB_013c84e9:
    if (SVar2 != SHADERTYPE_VERTEX) goto LAB_013c851f;
  }
  else {
    if (pPVar4->iterCountType != ITERCOUNTTYPE_DYNAMIC) goto LAB_013c84e9;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"in highp int a_iterCount;\n",0x1a);
    if (SVar2 != SHADERTYPE_VERTEX) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"flat out highp int v_iterCount;\n",0x20);
      pcVar9 = "flat in highp int v_iterCount;\n";
      goto LAB_013c84dc;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"out mediump vec4 v_color;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"in mediump vec4 v_color;\n",0x19);
LAB_013c851f:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"out mediump vec4 o_color;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\nvoid main (void)\n{\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = vec4(a_position, 0.0, 1.0);\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_PointSize = 1.0;\n",0x15);
  if ((SVar2 != SHADERTYPE_VERTEX) && (pPVar4->iterCountType == ITERCOUNTTYPE_DYNAMIC)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tv_iterCount = a_iterCount;\n",0x1c);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nvoid main (void)\n{\n",0x14);
  IVar3 = pPVar4->iterCountType;
  if (IVar3 == ITERCOUNTTYPE_STATIC) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
    std::ostream::operator<<(local_570,pPVar4->maxLoopIterCount);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
    std::ios_base::~ios_base(local_500);
  }
  else if (IVar3 == ITERCOUNTTYPE_UNIFORM) {
    local_610 = &local_608._M_string_length;
    local_608._M_string_length._0_7_ = 0x43726574695f75;
    local_608._M_string_length._7_1_ = 0x6f;
    local_608.field_2._M_allocated_capacity._0_2_ = 0x6e75;
    local_608.field_2._M_local_buf[2] = 't';
    local_608._M_dataplus._M_p = (pointer)0xb;
    local_608.field_2._M_local_buf[3] = '\0';
  }
  else if (IVar3 == ITERCOUNTTYPE_DYNAMIC) {
    pcVar9 = "a_iterCount";
    if (SVar2 != SHADERTYPE_VERTEX) {
      pcVar9 = "v_iterCount";
    }
    local_610 = &local_608._M_string_length;
    pcVar5 = "a_iterCount";
    if (SVar2 != SHADERTYPE_VERTEX) {
      pcVar5 = "v_iterCount";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,pcVar9,pcVar5 + 0xb);
  }
  else {
    local_610 = &local_608._M_string_length;
    local_608._M_string_length._0_7_ = 0x696c61766e693c;
    local_608._M_string_length._7_1_ = 100;
    local_608.field_2._M_allocated_capacity._0_2_ = 0x3e;
    local_608._M_dataplus._M_p = (pointer)0x9;
  }
  poVar7 = (ostream *)local_320;
  if (SVar2 != SHADERTYPE_VERTEX) {
    poVar7 = (ostream *)local_1a8;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tmediump vec4 color = ",0x16);
  pcVar9 = "a_position.xyxy";
  if (SVar2 != SHADERTYPE_VERTEX) {
    pcVar9 = "gl_FragCoord";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,pcVar9,(ulong)(SVar2 == SHADERTYPE_VERTEX) * 3 + 0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
  if (pPVar4->loopType == LOOPTYPE_WHILE) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp int i = 0;\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\twhile (i < ",0xc);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_610,(long)local_608._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," || ",4);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_610,(long)local_608._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," < 0) {\n",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\ti += 1;\n",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"color = cos(sin(color*1.25)*0.8);",0x21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    lVar8 = 3;
    pcVar9 = "\t}\n";
  }
  else if (pPVar4->loopType == LOOPTYPE_FOR) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tfor (highp int i = 0; i < ",0x1b);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_610,(long)local_608._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," || ",4);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_610,(long)local_608._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," < 0; ++i)\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"color = cos(sin(color*1.25)*0.8);",0x21);
    lVar8 = 1;
    pcVar9 = "\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp int i = 0;\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tdo {\n",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\ti += 1;\n",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"color = cos(sin(color*1.25)*0.8);",0x21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t} while (i <= ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_610,(long)local_608._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," || ",4);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_610,(long)local_608._M_dataplus._M_p);
    lVar8 = 7;
    pcVar9 = " < 0);\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,lVar8);
  if (local_610 != &local_608._M_string_length) {
    operator_delete(local_610,
                    CONCAT17(local_608._M_string_length._7_1_,(undefined7)local_608._M_string_length
                            ) + 1);
  }
  if (SVar2 == SHADERTYPE_VERTEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tv_color = color;\n",0x12);
    lVar8 = 0x14;
    pcVar9 = "\to_color = v_color;\n";
  }
  else {
    lVar8 = 0x12;
    pcVar9 = "\to_color = color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,lVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_4c0[0x10] = 0;
  local_4c0._17_8_ = 0;
  local_4c0._0_8_ = (pointer)0x0;
  local_4c0[8] = 0;
  local_4c0._9_7_ = 0;
  memset(local_570,0,0xac);
  std::__cxx11::stringbuf::str();
  local_610 = (size_type *)((ulong)local_610 & 0xffffffff00000000);
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_608,local_5b8,local_5b0 + (long)local_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_570 + ((ulong)local_610 & 0xffffffff) * 0x18),&local_608);
  std::__cxx11::stringbuf::str();
  local_598 = 1;
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_590,local_5d8,local_5d0 + (long)local_5d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_570 + (ulong)local_598 * 0x18),&local_590);
  lVar8 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_3f0.sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_570 + lVar8));
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&local_3f0.attribLocationBindings,&local_4e0);
  local_3f0.transformFeedbackBufferMode = local_4c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3f0.transformFeedbackVaryings,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_4c0);
  local_3f0.separable = (bool)local_4c0[0x18];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if (local_5d8 != local_5c8) {
    operator_delete(local_5d8,local_5c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,
                    CONCAT44(local_608.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_608.field_2._M_local_buf[3],
                                      CONCAT12(local_608.field_2._M_local_buf[2],
                                               local_608.field_2._M_allocated_capacity._0_2_))) + 1)
    ;
  }
  if (local_5b8 != local_5a8) {
    operator_delete(local_5b8,local_5a8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4c0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_4e0);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_570 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  pSVar6 = local_5e8;
  glu::ShaderProgram::ShaderProgram(local_5e8,local_5e0,&local_3f0);
  this->m_program = pSVar6;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3f0.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_3f0.attribLocationBindings);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3f0.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    this->m_caseIterNdx = 0;
    if (this->m_params->iterCountType != ITERCOUNTTYPE_STATIC) {
      local_570._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_570 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Loop iteration counts in range: [",0x21);
      std::ostream::operator<<(poVar1,this->m_params->minLoopIterCount);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::operator<<(poVar1,this->m_params->maxLoopIterCount);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_570,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_4f8);
    }
    local_570._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_570 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Number of vertices and fragments: ",0x22);
    std::ostream::operator<<(poVar1,this->m_params->numInvocations);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_570,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_4f8);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return extraout_EAX;
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])(this);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Failed to compile shader program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sLongRunningShaderTests.cpp"
             ,0xdb);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void LongRunningShaderCase::init (void)
{
	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), genSources(*m_params));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		deinit();
		TCU_FAIL("Failed to compile shader program");
	}

	m_caseIterNdx = 0;

	if (m_params->iterCountType != ITERCOUNTTYPE_STATIC)
	{
		m_testCtx.getLog() << TestLog::Message << "Loop iteration counts in range: [" << m_params->minLoopIterCount
											   << ", " << m_params->maxLoopIterCount << "]"
						   << TestLog::EndMessage;
	}

	m_testCtx.getLog() << TestLog::Message << "Number of vertices and fragments: " << m_params->numInvocations << TestLog::EndMessage;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass"); // Test will pass or timeout, unless driver/device crashes.
}